

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_disposition(AMQP_VALUE value,DISPOSITION_HANDLE *disposition_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  DISPOSITION_HANDLE pDVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE pAVar6;
  uint32_t list_item_count;
  _Bool batchable;
  _Bool settled;
  role role;
  delivery_number last;
  delivery_number first;
  uint local_44;
  int local_40;
  _Bool local_3b;
  _Bool local_3a;
  _Bool local_39;
  uint32_t local_38;
  uint32_t local_34;
  
  pDVar4 = (DISPOSITION_HANDLE)malloc(8);
  if (pDVar4 == (DISPOSITION_HANDLE)0x0) {
    *disposition_handle = (DISPOSITION_HANDLE)0x0;
    iVar3 = 0x209d;
  }
  else {
    pDVar4->composite_value = (AMQP_VALUE)0x0;
    *disposition_handle = pDVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      disposition_destroy(*disposition_handle);
      iVar3 = 0x20a5;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_44);
      iVar3 = 0x20ac;
      if (iVar1 == 0) {
        if (local_44 == 0) {
          iVar3 = 0x20d9;
        }
        else {
          pAVar6 = amqpvalue_get_list_item(pAVar5,0);
          if (pAVar6 == (AMQP_VALUE)0x0) {
            disposition_destroy(*disposition_handle);
            iVar3 = 0x20bb;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar6);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar6);
              disposition_destroy(*disposition_handle);
              iVar3 = 0x20c5;
            }
            else {
              iVar3 = amqpvalue_get_boolean(pAVar6,&local_39);
              if (iVar3 == 0) {
                amqpvalue_destroy(pAVar6);
                iVar3 = 0x2102;
                if (1 < local_44) {
                  pAVar6 = amqpvalue_get_list_item(pAVar5,1);
                  if (pAVar6 == (AMQP_VALUE)0x0) {
                    disposition_destroy(*disposition_handle);
                    iVar3 = 0x20e4;
                  }
                  else {
                    AVar2 = amqpvalue_get_type(pAVar6);
                    if (AVar2 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy(pAVar6);
                      disposition_destroy(*disposition_handle);
                      iVar3 = 0x20ee;
                    }
                    else {
                      iVar3 = amqpvalue_get_uint(pAVar6,&local_34);
                      if (iVar3 == 0) {
                        iVar3 = 0x20cf;
                        amqpvalue_destroy(pAVar6);
                        if ((2 < local_44) &&
                           (pAVar6 = amqpvalue_get_list_item(pAVar5,2), pAVar6 != (AMQP_VALUE)0x0))
                        {
                          AVar2 = amqpvalue_get_type(pAVar6);
                          if (AVar2 != AMQP_TYPE_NULL) {
                            local_40 = amqpvalue_get_uint(pAVar6,&local_38);
                            if (local_40 != 0) {
                              amqpvalue_destroy(pAVar6);
                              disposition_destroy(*disposition_handle);
                              iVar3 = 0x211a;
                            }
                            if (local_40 != 0) {
                              return iVar3;
                            }
                          }
                          amqpvalue_destroy(pAVar6);
                        }
                        if ((3 < local_44) &&
                           (pAVar6 = amqpvalue_get_list_item(pAVar5,3), pAVar6 != (AMQP_VALUE)0x0))
                        {
                          AVar2 = amqpvalue_get_type(pAVar6);
                          if (AVar2 != AMQP_TYPE_NULL) {
                            local_40 = amqpvalue_get_boolean(pAVar6,&local_3a);
                            if (local_40 != 0) {
                              amqpvalue_destroy(pAVar6);
                              disposition_destroy(*disposition_handle);
                              iVar3 = 0x2137;
                            }
                            if (local_40 != 0) {
                              return iVar3;
                            }
                          }
                          amqpvalue_destroy(pAVar6);
                        }
                        if ((4 < local_44) &&
                           (pAVar6 = amqpvalue_get_list_item(pAVar5,4), pAVar6 != (AMQP_VALUE)0x0))
                        {
                          amqpvalue_destroy(pAVar6);
                        }
                        if ((5 < local_44) &&
                           (pAVar5 = amqpvalue_get_list_item(pAVar5,5), pAVar5 != (AMQP_VALUE)0x0))
                        {
                          AVar2 = amqpvalue_get_type(pAVar5);
                          if ((AVar2 != AMQP_TYPE_NULL) &&
                             (iVar3 = amqpvalue_get_boolean(pAVar5,&local_3b), iVar3 != 0)) {
                            amqpvalue_destroy(pAVar5);
                            disposition_destroy(*disposition_handle);
                            return 0x2161;
                          }
                          amqpvalue_destroy(pAVar5);
                        }
                        pAVar5 = amqpvalue_clone(value);
                        pDVar4->composite_value = pAVar5;
                        iVar3 = 0;
                      }
                      else {
                        amqpvalue_destroy(pAVar6);
                        disposition_destroy(*disposition_handle);
                        iVar3 = 0x20f8;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy(pAVar6);
                disposition_destroy(*disposition_handle);
                iVar3 = 0x20cf;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_disposition(AMQP_VALUE value, DISPOSITION_HANDLE* disposition_handle)
{
    int result;
    DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition_create_internal();
    *disposition_handle = disposition_instance;
    if (*disposition_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            disposition_destroy(*disposition_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* role */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                disposition_destroy(*disposition_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                disposition_destroy(*disposition_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                role role;
                                if (amqpvalue_get_role(item_value, &role) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* first */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                disposition_destroy(*disposition_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                disposition_destroy(*disposition_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                delivery_number first;
                                if (amqpvalue_get_delivery_number(item_value, &first) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* last */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                delivery_number last;
                                if (amqpvalue_get_delivery_number(item_value, &last) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* settled */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool settled;
                                if (amqpvalue_get_boolean(item_value, &settled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* state */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* batchable */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool batchable;
                                if (amqpvalue_get_boolean(item_value, &batchable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    disposition_destroy(*disposition_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    disposition_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}